

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

void __thiscall jpge::jpeg_encoder::load_block_16_8(jpeg_encoder *this,int x,int c)

{
  uint8 *puVar1;
  uint8 *puVar2;
  sample_array_t *psVar3;
  long lVar4;
  ulong uVar5;
  
  psVar3 = this->m_sample_array;
  lVar4 = (long)(x * 0x30 + c);
  uVar5 = 0xfffffffffffffffe;
  do {
    puVar1 = this->m_mcu_lines[uVar5 + 2];
    puVar2 = this->m_mcu_lines[uVar5 + 3];
    *psVar3 = ((uint)puVar2[lVar4] + (uint)puVar1[lVar4 + 3] + (uint)puVar1[lVar4] +
               (uint)puVar2[lVar4 + 3] + 2 >> 2) - 0x80;
    psVar3[1] = ((uint)puVar2[lVar4 + 6] + (uint)puVar1[lVar4 + 9] + (uint)puVar1[lVar4 + 6] +
                 (uint)puVar2[lVar4 + 9] + 2 >> 2) - 0x80;
    psVar3[2] = ((uint)puVar2[lVar4 + 0xc] + (uint)puVar1[lVar4 + 0xf] + (uint)puVar1[lVar4 + 0xc] +
                 (uint)puVar2[lVar4 + 0xf] + 2 >> 2) - 0x80;
    psVar3[3] = ((uint)puVar2[lVar4 + 0x12] +
                 (uint)puVar1[lVar4 + 0x15] + (uint)puVar1[lVar4 + 0x12] +
                 (uint)puVar2[lVar4 + 0x15] + 2 >> 2) - 0x80;
    psVar3[4] = ((uint)puVar2[lVar4 + 0x18] +
                 (uint)puVar1[lVar4 + 0x1b] + (uint)puVar1[lVar4 + 0x18] +
                 (uint)puVar2[lVar4 + 0x1b] + 2 >> 2) - 0x80;
    psVar3[5] = ((uint)puVar2[lVar4 + 0x1e] +
                 (uint)puVar1[lVar4 + 0x21] + (uint)puVar1[lVar4 + 0x1e] +
                 (uint)puVar2[lVar4 + 0x21] + 2 >> 2) - 0x80;
    psVar3[6] = ((uint)puVar2[lVar4 + 0x24] +
                 (uint)puVar1[lVar4 + 0x27] + (uint)puVar1[lVar4 + 0x24] +
                 (uint)puVar2[lVar4 + 0x27] + 2 >> 2) - 0x80;
    psVar3[7] = ((uint)puVar2[lVar4 + 0x2d] +
                 (uint)puVar2[lVar4 + 0x2a] +
                 (uint)puVar1[lVar4 + 0x2d] + (uint)puVar1[lVar4 + 0x2a] + 2 >> 2) - 0x80;
    psVar3 = psVar3 + 8;
    uVar5 = uVar5 + 2;
  } while (uVar5 < 0xe);
  return;
}

Assistant:

void jpeg_encoder::load_block_16_8(int x, int c)
	{
		uint8* pSrc1, * pSrc2;
		sample_array_t* pDst = m_sample_array;
		x = (x * (16 * 3)) + c;
		for (int i = 0; i < 16; i += 2, pDst += 8)
		{
			pSrc1 = m_mcu_lines[i + 0] + x;
			pSrc2 = m_mcu_lines[i + 1] + x;
			pDst[0] = ((pSrc1[0 * 3] + pSrc1[1 * 3] + pSrc2[0 * 3] + pSrc2[1 * 3] + 2) >> 2) - 128; pDst[1] = ((pSrc1[2 * 3] + pSrc1[3 * 3] + pSrc2[2 * 3] + pSrc2[3 * 3] + 2) >> 2) - 128;
			pDst[2] = ((pSrc1[4 * 3] + pSrc1[5 * 3] + pSrc2[4 * 3] + pSrc2[5 * 3] + 2) >> 2) - 128; pDst[3] = ((pSrc1[6 * 3] + pSrc1[7 * 3] + pSrc2[6 * 3] + pSrc2[7 * 3] + 2) >> 2) - 128;
			pDst[4] = ((pSrc1[8 * 3] + pSrc1[9 * 3] + pSrc2[8 * 3] + pSrc2[9 * 3] + 2) >> 2) - 128; pDst[5] = ((pSrc1[10 * 3] + pSrc1[11 * 3] + pSrc2[10 * 3] + pSrc2[11 * 3] + 2) >> 2) - 128;
			pDst[6] = ((pSrc1[12 * 3] + pSrc1[13 * 3] + pSrc2[12 * 3] + pSrc2[13 * 3] + 2) >> 2) - 128; pDst[7] = ((pSrc1[14 * 3] + pSrc1[15 * 3] + pSrc2[14 * 3] + pSrc2[15 * 3] + 2) >> 2) - 128;
		}
	}